

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

weak_ptr<TestSharedPtrObj> * __thiscall
rcc::weak_ptr<TestSharedPtrObj>::operator=
          (weak_ptr<TestSharedPtrObj> *this,weak_ptr<TestSharedPtrObj> *other)

{
  weak_ptr<TestSharedPtrObj> *other_local;
  weak_ptr<TestSharedPtrObj> *this_local;
  
  if (this->obj_state != (IObjectSharedState *)0x0) {
    IObjectSharedState::DecrementState(this->obj_state);
  }
  this->obj_state = other->obj_state;
  if (this->obj_state != (IObjectSharedState *)0x0) {
    other->obj_state = (IObjectSharedState *)0x0;
  }
  return this;
}

Assistant:

weak_ptr & operator= ( weak_ptr && other){
            if(obj_state){
                obj_state->DecrementState();
            }
            obj_state = other.obj_state;
            if(obj_state){
                other.obj_state = nullptr;
            }
            return *this;
        }